

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int obmc_diamond_search_sad
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,FULLPEL_MV *best_mv,
              int search_step,int *num00)

{
  FULLPEL_MV FVar1;
  buf_2d *pbVar2;
  int32_t *piVar3;
  bool bVar4;
  search_site_config *psVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int idx;
  long lVar10;
  uint uVar11;
  int iVar12;
  FULLPEL_MV FVar13;
  uint8_t *local_a0;
  FULLPEL_MV local_94;
  int *local_90;
  uint8_t *local_88;
  MV_COST_PARAMS *local_80;
  int32_t *local_78;
  aom_variance_fn_ptr_t *local_70;
  FULLPEL_MV *local_68;
  search_site_config *local_60;
  search_site (*local_58) [17];
  int32_t *local_50;
  buf_2d *local_48;
  FullMvLimits *local_40;
  FULLPEL_MV start_mv_local;
  
  local_70 = ms_params->vfp;
  pbVar2 = (ms_params->ms_buffers).ref;
  local_60 = ms_params->search_sites;
  local_80 = &ms_params->mv_cost_params;
  piVar3 = (ms_params->ms_buffers).wsrc;
  local_78 = (ms_params->ms_buffers).obmc_mask;
  local_40 = &ms_params->mv_limits;
  iVar12 = local_60->num_search_steps;
  local_90 = num00;
  start_mv_local = start_mv;
  clamp_fullmv(&start_mv_local,local_40);
  local_a0 = pbVar2->buf +
             (long)start_mv_local.col + (long)start_mv_local.row * (long)pbVar2->stride;
  *local_90 = 0;
  *best_mv = start_mv_local;
  local_50 = piVar3;
  local_48 = pbVar2;
  uVar11 = (*local_70->osdf)(local_a0,pbVar2->stride,piVar3,local_78);
  local_68 = best_mv;
  iVar6 = mvsad_err_cost_(best_mv,local_80);
  iVar6 = iVar6 + uVar11;
  local_88 = local_a0;
  for (uVar11 = ~search_step + iVar12; psVar5 = local_60, -1 < (int)uVar11; uVar11 = uVar11 - 1) {
    local_58 = local_60->site + uVar11;
    iVar12 = 0;
    for (lVar10 = 1; lVar10 <= local_60->searches_per_step[uVar11]; lVar10 = lVar10 + 1) {
      FVar1 = psVar5->site[uVar11][lVar10].mv;
      local_94.row = FVar1.row + (*local_68).row;
      local_94.col = FVar1.col + (*local_68).col;
      iVar7 = av1_is_fullmv_in_range(local_40,local_94);
      if (iVar7 != 0) {
        uVar8 = (*local_70->osdf)(local_a0 + psVar5->site[uVar11][lVar10].offset,local_48->stride,
                                  local_50,local_78);
        if ((int)uVar8 < iVar6) {
          iVar9 = mvsad_err_cost_(&local_94,local_80);
          iVar9 = iVar9 + uVar8;
          iVar7 = iVar6;
          if (iVar9 < iVar6) {
            iVar7 = iVar9;
          }
          bVar4 = iVar9 < iVar6;
          iVar6 = iVar7;
          if (bVar4) {
            iVar12 = (int)lVar10;
          }
        }
      }
    }
    if (iVar12 == 0) {
      if (local_a0 == local_88) {
        *local_90 = *local_90 + 1;
        local_a0 = local_88;
      }
    }
    else {
      FVar1 = (*local_58)[iVar12].mv;
      FVar13.row = (*local_68).row + FVar1.row;
      FVar13.col = (*local_68).col + FVar1.col;
      *local_68 = FVar13;
      local_a0 = local_a0 + (*local_58)[iVar12].offset;
    }
  }
  return iVar6;
}

Assistant:

static int obmc_diamond_search_sad(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, FULLPEL_MV start_mv,
    FULLPEL_MV *best_mv, int search_step, int *num00) {
  const aom_variance_fn_ptr_t *fn_ptr = ms_params->vfp;
  const search_site_config *cfg = ms_params->search_sites;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const struct buf_2d *const ref_buf = ms_buffers->ref;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  const uint8_t *best_address, *init_ref;
  int best_sad = INT_MAX;
  int best_site = 0;

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  best_address = init_ref = get_buf_from_fullmv(ref_buf, &start_mv);
  *num00 = 0;
  *best_mv = start_mv;

  // Check the starting position
  best_sad = fn_ptr->osdf(best_address, ref_buf->stride, wsrc, mask) +
             mvsad_err_cost_(best_mv, mv_cost_params);

  for (int step = tot_steps - 1; step >= 0; --step) {
    const search_site *const site = cfg->site[step];
    best_site = 0;
    for (int idx = 1; idx <= cfg->searches_per_step[step]; ++idx) {
      const FULLPEL_MV mv = { best_mv->row + site[idx].mv.row,
                              best_mv->col + site[idx].mv.col };
      if (av1_is_fullmv_in_range(&ms_params->mv_limits, mv)) {
        int sad = fn_ptr->osdf(best_address + site[idx].offset, ref_buf->stride,
                               wsrc, mask);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = idx;
          }
        }
      }
    }

    if (best_site != 0) {
      best_mv->row += site[best_site].mv.row;
      best_mv->col += site[best_site].mv.col;
      best_address += site[best_site].offset;
    } else if (best_address == init_ref) {
      (*num00)++;
    }
  }
  return best_sad;
}